

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O0

void Palette16Generic(PalEntry *pal)

{
  ushort local_22;
  ushort local_20;
  ushort local_1e;
  int iStack_1c;
  WORD bpart;
  WORD gpart;
  WORD rpart;
  int i;
  WORD *p16;
  PalEntry *pal_local;
  
  _gpart = &GPfxPal;
  p16 = (WORD *)pal;
  for (iStack_1c = 0x100; iStack_1c != 0; iStack_1c = iStack_1c + -1) {
    if ((GPfx._15_1_ & 1) == 0) {
      local_1e = (ushort)((int)(uint)(byte)p16[1] >> (GPfx.RedShift & 0x1f));
    }
    else {
      local_1e = (ushort)(byte)p16[1] << (GPfx.RedShift & 0x1f);
    }
    if (((byte)GPfx._15_1_ >> 2 & 1) == 0) {
      local_20 = (ushort)((int)(uint)*(byte *)((long)p16 + 1) >> (GPfx.GreenShift & 0x1f));
    }
    else {
      local_20 = (ushort)*(byte *)((long)p16 + 1) << (GPfx.GreenShift & 0x1f);
    }
    if (((byte)GPfx._15_1_ >> 1 & 1) == 0) {
      local_22 = (ushort)((int)(uint)(byte)*p16 >> (GPfx.BlueShift & 0x1f));
    }
    else {
      local_22 = (ushort)(byte)*p16 << (GPfx.BlueShift & 0x1f);
    }
    _gpart->Pal16[0] =
         local_1e & GPfx.Masks.Bits16.Red | local_20 & GPfx.Masks.Bits16.Green |
         local_22 & GPfx.Masks.Bits16.Blue;
    p16 = p16 + 2;
    _gpart = (PfxUnion *)(_gpart->Pal16 + 1);
  }
  return;
}

Assistant:

static void Palette16Generic (const PalEntry *pal)
{
	WORD *p16;
	int i;

	for (p16 = GPfxPal.Pal16, i = 256; i != 0; i--, pal++, p16++)
	{
		WORD rpart, gpart, bpart;

		if (GPfx.RedLeft)	rpart = pal->r << GPfx.RedShift;
		else				rpart = pal->r >> GPfx.RedShift;

		if (GPfx.GreenLeft)	gpart = pal->g << GPfx.GreenShift;
		else				gpart = pal->g >> GPfx.GreenShift;

		if (GPfx.BlueLeft)	bpart = pal->b << GPfx.BlueShift;
		else				bpart = pal->b >> GPfx.BlueShift;

		*p16 = (rpart & GPfx.Masks.Bits16.Red) |
			   (gpart & GPfx.Masks.Bits16.Green) |
			   (bpart & GPfx.Masks.Bits16.Blue);
	}
}